

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

bool EV_DoElevator(line_t_conflict *line,EElevator elevtype,double speed,double height,int tag)

{
  bool bVar1;
  int iVar2;
  sector_t_conflict *sec_00;
  DSectorEffect *pDVar3;
  DElevator *this;
  size_t len;
  double dVar4;
  double dVar5;
  double dVar6;
  FSectorTagIterator local_78;
  FSectorTagIterator itr;
  vertex_t *spot;
  double newheight;
  double ceilingheight;
  double floorheight;
  DElevator *elevator;
  sector_t_conflict *sec;
  bool rtn;
  int secnum;
  int tag_local;
  double height_local;
  double speed_local;
  EElevator elevtype_local;
  line_t_conflict *line_local;
  
  if ((line == (line_t_conflict *)0x0) && (elevtype == elevateCurrent)) {
    line_local._7_1_ = false;
  }
  else {
    line_local._7_1_ = false;
    FSectorTagIterator::FSectorTagIterator(&local_78,tag,line);
    while (iVar2 = FSectorTagIterator::Next(&local_78), -1 < iVar2) {
      sec_00 = sectors + iVar2;
      len = 0;
      bVar1 = sector_t::PlaneMoving((sector_t *)sec_00,0);
      if ((!bVar1) &&
         (pDVar3 = TObjPtr::operator_cast_to_DSectorEffect_((TObjPtr *)&sec_00->ceilingdata),
         pDVar3 == (DSectorEffect *)0x0)) {
        line_local._7_1_ = true;
        this = (DElevator *)DObject::operator_new((DObject *)0x78,len);
        DElevator::DElevator(this,sec_00);
        this->m_Type = elevtype;
        this->m_Speed = speed;
        DElevator::StartFloorSound(this);
        dVar4 = sector_t::CenterFloor((sector_t *)sec_00);
        dVar5 = sector_t::CenterCeiling((sector_t *)sec_00);
        switch(elevtype) {
        case elevateUp:
          this->m_Direction = 1;
          dVar4 = sector_t::FindNextHighestFloor((sector_t *)sec_00,(vertex_t **)&itr);
          dVar5 = secplane_t::PointToDist(&sec_00->floorplane,(vertex_t *)itr,dVar4);
          this->m_FloorDestDist = dVar5;
          dVar5 = secplane_t::ZatPoint(&sec_00->ceilingplane,(vertex_t *)itr);
          dVar6 = secplane_t::ZatPoint(&sec_00->floorplane,(vertex_t *)itr);
          dVar4 = secplane_t::PointToDist
                            (&sec_00->ceilingplane,(vertex_t *)itr,(dVar5 - dVar6) + dVar4);
          this->m_CeilingDestDist = dVar4;
          break;
        case elevateDown:
          this->m_Direction = -1;
          dVar4 = sector_t::FindNextLowestFloor((sector_t *)sec_00,(vertex_t **)&itr);
          dVar5 = secplane_t::PointToDist(&sec_00->floorplane,(vertex_t *)itr,dVar4);
          this->m_FloorDestDist = dVar5;
          dVar5 = secplane_t::ZatPoint(&sec_00->ceilingplane,(vertex_t *)itr);
          dVar6 = secplane_t::ZatPoint(&sec_00->floorplane,(vertex_t *)itr);
          dVar4 = secplane_t::PointToDist
                            (&sec_00->ceilingplane,(vertex_t *)itr,(dVar5 - dVar6) + dVar4);
          this->m_CeilingDestDist = dVar4;
          break;
        case elevateCurrent:
          dVar4 = secplane_t::ZatPoint(&line->frontsector->floorplane,line->v1);
          dVar5 = secplane_t::PointToDist(&sec_00->floorplane,line->v1,dVar4);
          this->m_FloorDestDist = dVar5;
          dVar5 = secplane_t::ZatPoint(&sec_00->ceilingplane,line->v1);
          dVar6 = secplane_t::ZatPoint(&sec_00->floorplane,line->v1);
          dVar4 = secplane_t::PointToDist(&sec_00->ceilingplane,line->v1,(dVar5 - dVar6) + dVar4);
          this->m_CeilingDestDist = dVar4;
          dVar4 = this->m_FloorDestDist;
          dVar5 = secplane_t::fD(&sec_00->floorplane);
          iVar2 = 1;
          if (dVar5 < dVar4) {
            iVar2 = -1;
          }
          this->m_Direction = iVar2;
          break;
        case elevateRaise:
          this->m_Direction = 1;
          dVar4 = secplane_t::PointToDist(&sec_00->floorplane,&sec_00->centerspot,dVar4 + height);
          this->m_FloorDestDist = dVar4;
          dVar4 = secplane_t::PointToDist(&sec_00->ceilingplane,&sec_00->centerspot,dVar5 + height);
          this->m_CeilingDestDist = dVar4;
          break;
        case elevateLower:
          this->m_Direction = -1;
          dVar4 = secplane_t::PointToDist(&sec_00->floorplane,&sec_00->centerspot,dVar4 - height);
          this->m_FloorDestDist = dVar4;
          dVar4 = secplane_t::PointToDist(&sec_00->ceilingplane,&sec_00->centerspot,dVar5 - height);
          this->m_CeilingDestDist = dVar4;
        }
      }
    }
  }
  return line_local._7_1_;
}

Assistant:

bool EV_DoElevator (line_t *line, DElevator::EElevator elevtype,
					double speed, double height, int tag)
{
	int			secnum;
	bool		rtn;
	sector_t*	sec;
	DElevator*	elevator;
	double		floorheight, ceilingheight;
	double		newheight;
	vertex_t*	spot;

	if (!line && (elevtype == DElevator::elevateCurrent))
		return false;

	secnum = -1;
	rtn = false;

	FSectorTagIterator itr(tag, line);

	// act on all sectors with the same tag as the triggering linedef
	while ((secnum = itr.Next()) >= 0)
	{
		sec = &sectors[secnum];
		// If either floor or ceiling is already activated, skip it
		if (sec->PlaneMoving(sector_t::floor) || sec->ceilingdata) //jff 2/22/98
			continue; // the loop used to break at the end if tag were 0, but would miss that step if "continue" occured [FDARI]

		// create and initialize new elevator thinker
		rtn = true;
		elevator = new DElevator (sec);
		elevator->m_Type = elevtype;
		elevator->m_Speed = speed;
		elevator->StartFloorSound ();

		floorheight = sec->CenterFloor ();
		ceilingheight = sec->CenterCeiling ();

		// set up the fields according to the type of elevator action
		switch (elevtype)
		{
		// elevator down to next floor
		case DElevator::elevateDown:
			elevator->m_Direction = -1;
			newheight = sec->FindNextLowestFloor (&spot);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (spot, newheight);
			newheight += sec->ceilingplane.ZatPoint(spot) - sec->floorplane.ZatPoint(spot);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (spot, newheight);
			break;

		// elevator up to next floor
		case DElevator::elevateUp:
			elevator->m_Direction = 1;
			newheight = sec->FindNextHighestFloor (&spot);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (spot, newheight);
			newheight += sec->ceilingplane.ZatPoint(spot) - sec->floorplane.ZatPoint(spot);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (spot, newheight);
			break;

		// elevator to floor height of activating switch's front sector
		case DElevator::elevateCurrent:
			newheight = line->frontsector->floorplane.ZatPoint (line->v1);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (line->v1, newheight);
			newheight += sec->ceilingplane.ZatPoint(line->v1) - sec->floorplane.ZatPoint(line->v1);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (line->v1, newheight);

			elevator->m_Direction =
				elevator->m_FloorDestDist > sec->floorplane.fD() ? -1 : 1;
			break;

		// [RH] elevate up by a specific amount
		case DElevator::elevateRaise:
			elevator->m_Direction = 1;
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (sec->centerspot, floorheight + height);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (sec->centerspot, ceilingheight + height);
			break;

		// [RH] elevate down by a specific amount
		case DElevator::elevateLower:
			elevator->m_Direction = -1;
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (sec->centerspot, floorheight - height);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (sec->centerspot, ceilingheight - height);
			break;
		}
	}
	return rtn;
}